

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MethodBuilder.cpp
# Opt level: O2

CompiledMethod * __thiscall
Lodtalk::MethodAssembler::Assembler::generate
          (Assembler *this,size_t temporalCount,size_t argumentCount,bool hasPrimitive,
          size_t extraSize)

{
  pointer pOVar1;
  pointer ppIVar2;
  int iVar3;
  size_t sVar4;
  long lVar5;
  CompiledMethodHeader header;
  CompiledMethod *pCVar6;
  undefined4 extraout_var;
  undefined7 in_register_00000009;
  ulong uVar8;
  pointer ppIVar9;
  undefined1 *puVar10;
  undefined1 *puVar7;
  
  sVar4 = computeInstructionsSize(this);
  lVar5 = (long)(this->literals).
                super__Vector_base<Lodtalk::OopRef,_std::allocator<Lodtalk::OopRef>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->literals).
                super__Vector_base<Lodtalk::OopRef,_std::allocator<Lodtalk::OopRef>_>._M_impl.
                super__Vector_impl_data._M_start;
  header = CompiledMethodHeader::create
                     (lVar5 >> 5,temporalCount,argumentCount,
                      (ulong)(uint)((int)CONCAT71(in_register_00000009,hasPrimitive) << 0x11));
  pCVar6 = CompiledMethod::newMethodWithHeader
                     (this->context,extraSize + sVar4 + (lVar5 >> 2),header);
  lVar5 = 0;
  for (uVar8 = 0;
      pOVar1 = (this->literals).
               super__Vector_base<Lodtalk::OopRef,_std::allocator<Lodtalk::OopRef>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar8 < (ulong)((long)(this->literals).
                            super__Vector_base<Lodtalk::OopRef,_std::allocator<Lodtalk::OopRef>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)pOVar1 >> 5);
      uVar8 = uVar8 + 1) {
    pCVar6[uVar8 + 2].super_ByteArray.super_ArrayedCollection.super_SequenceableCollection.
    super_Collection.super_Object.super_ProtoObject.object_header_ =
         *(ObjectHeader *)((long)&(pOVar1->oop).field_0 + lVar5);
    lVar5 = lVar5 + 0x20;
  }
  uVar8 = (ulong)(*(uint *)&pCVar6[1].super_ByteArray.super_ArrayedCollection.
                            super_SequenceableCollection.super_Collection.super_Object.
                            super_ProtoObject.object_header_ & 0x1fffe);
  puVar7 = &pCVar6[2].super_ByteArray.super_ArrayedCollection.super_SequenceableCollection.
            super_Collection.super_Object.super_ProtoObject.object_header_.field_0x0 + uVar8 * 4;
  puVar10 = &pCVar6[2].super_ByteArray.super_ArrayedCollection.super_SequenceableCollection.
             super_Collection.super_Object.super_ProtoObject.object_header_.field_0x0 +
            sVar4 + uVar8 * 4;
  ppIVar9 = (this->instructionStream).
            super__Vector_base<Lodtalk::MethodAssembler::InstructionNode_*,_std::allocator<Lodtalk::MethodAssembler::InstructionNode_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppIVar2 = (this->instructionStream).
            super__Vector_base<Lodtalk::MethodAssembler::InstructionNode_*,_std::allocator<Lodtalk::MethodAssembler::InstructionNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (ppIVar9 == ppIVar2) {
      if (puVar7 < puVar10) {
        printf("extra size %zu\n",(long)puVar10 - (long)puVar7);
      }
      return pCVar6;
    }
    iVar3 = (*(*ppIVar9)->_vptr_InstructionNode[3])(*ppIVar9,puVar7);
    puVar7 = (undefined1 *)CONCAT44(extraout_var,iVar3);
    ppIVar9 = ppIVar9 + 1;
  } while (puVar7 <= puVar10);
  fwrite("Fatal error: Memory corruption\n",0x1f,1,_stderr);
  abort();
}

Assistant:

CompiledMethod *Assembler::generate(size_t temporalCount, size_t argumentCount, bool hasPrimitive, size_t extraSize)
{
	// Compute the method sizes.
	auto instructionsSize = computeInstructionsSize();
	auto literalCount = literals.size();
	auto methodSize = literalCount*sizeof(void*) + instructionsSize + extraSize;

	// Create the method header
    size_t extraFlags = 0;
    if(hasPrimitive)
        extraFlags |= CompiledMethodHeader::HasPrimitiveBit;

	auto methodHeader = CompiledMethodHeader::create(literalCount, temporalCount, argumentCount, extraFlags);

	// Create the compiled method
	auto compiledMethod = CompiledMethod::newMethodWithHeader(context, methodSize, methodHeader);

	// Set the compiled method literals
	auto literalData = compiledMethod->getFirstLiteralPointer();
	for(size_t i = 0; i < literals.size(); ++i)
		literalData[i] = literals[i].oop;

	// Encode the bytecode instructions.
	auto instructionBuffer = compiledMethod->getFirstBCPointer();
	auto instructionBufferEnd = instructionBuffer + instructionsSize;
	for(auto &instr : instructionStream)
	{
		instructionBuffer = instr->encode(instructionBuffer);
		if(instructionBuffer > instructionBufferEnd)
		{
			fprintf(stderr, "Fatal error: Memory corruption\n");
			abort();
		}
	}

    if(instructionBuffer < instructionBufferEnd)
        printf("extra size %zu\n", instructionBufferEnd - instructionBuffer);

	return compiledMethod;
}